

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O2

ion_err_t ion_delete_dictionary(ion_dictionary_t *dictionary,ion_dictionary_id_t id)

{
  ion_dictionary_id_t id_00;
  ion_err_t iVar1;
  ion_err_t iVar2;
  ion_dictionary_type_t type;
  ion_dictionary_handler_t handler;
  ion_dictionary_handler_t local_60;
  
  if (dictionary->status == '\x01') {
    type = ion_get_dictionary_type(id);
    iVar1 = '\x04';
    if (type != dictionary_type_error_t) {
      ion_switch_handler(type,&local_60);
      iVar1 = dictionary_destroy_dictionary(&local_60,id);
      if (iVar1 == '\0') {
        iVar1 = ion_delete_from_master_table(id);
      }
    }
  }
  else {
    id_00 = dictionary->instance->id;
    iVar2 = dictionary_delete_dictionary(dictionary);
    iVar1 = '\x04';
    if (iVar2 == '\0') {
      iVar2 = ion_delete_from_master_table(id_00);
      return iVar2;
    }
  }
  return iVar1;
}

Assistant:

ion_err_t
ion_delete_dictionary(
	ion_dictionary_t	*dictionary,
	ion_dictionary_id_t id
) {
	ion_err_t				err;
	ion_dictionary_type_t	type;

	if (ion_dictionary_status_closed != dictionary->status) {
		id	= dictionary->instance->id;
		err = dictionary_delete_dictionary(dictionary);

		if (err_ok != err) {
			return err_dictionary_destruction_error;
		}

		err = ion_delete_from_master_table(id);
	}
	else {
		type = ion_get_dictionary_type(id);

		if (dictionary_type_error_t == type) {
			return err_dictionary_destruction_error;
		}

		ion_dictionary_handler_t handler;

		ion_switch_handler(type, &handler);

		err = dictionary_destroy_dictionary(&handler, id);

		if (err_ok != err) {
			return err;
		}

		err = ion_delete_from_master_table(id);
	}

	return err;
}